

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

Qiniu_Error
Qiniu_Io_PutFile(Qiniu_Client *self,Qiniu_Io_PutRet *ret,char *uptoken,char *key,char *localFile,
                Qiniu_Io_PutExtra *extra)

{
  Qiniu_Io_PutExtra *extra_00;
  Qiniu_Bool QVar1;
  uint uVar2;
  char *pcVar3;
  Qiniu_Error QVar4;
  char *bucketName;
  char *accessKey;
  Qiniu_Io_form form;
  Qiniu_Io_PutExtra *extra_local;
  Qiniu_Rd_Reader local_e8;
  Qiniu_FileInfo fi;
  
  accessKey = (char *)0x0;
  bucketName = (char *)0x0;
  extra_local = extra;
  QVar1 = Qiniu_Utils_Extract_Bucket(uptoken,&accessKey,&bucketName);
  if (QVar1 == 0) {
    pcVar3 = "parse uptoken failed";
    uVar2 = 400;
    goto LAB_00111fc8;
  }
  Qiniu_Io_form_init(&form,uptoken,key,&extra_local);
  extra_00 = extra_local;
  pcVar3 = "QINIU-C-SDK-UP-FILE";
  if (extra_local->localFileName != (char *)0x0) {
    pcVar3 = extra_local->localFileName;
  }
  if (extra_local->upAbortCallback == (Qiniu_Rd_FnAbort)0x0) {
    curl_formadd(&form,&form.lastptr,1,"file",10,localFile,0x10,pcVar3,0x11);
LAB_00111f4d:
    QVar4 = Qiniu_Io_call(self,accessKey,bucketName,ret,form.formpost,extra_00);
    pcVar3 = QVar4.message;
    uVar2 = QVar4.code;
    if (extra_00->upAbortCallback != (Qiniu_Rd_FnAbort)0x0) {
      Qiniu_Rd_Reader_Close(&local_e8);
      if (uVar2 == 0x2a) {
        if (local_e8.status == 1) {
          pcVar3 = "Upload progress has been aborted by caller";
          uVar2 = 0x2703;
        }
        else if (local_e8.status == 2) {
          pcVar3 = "Upload progress has been aborted by Qiniu_File_ReadAt()";
          uVar2 = 0x2702;
        }
        else {
          uVar2 = 0x2a;
        }
      }
    }
  }
  else {
    local_e8.file = (Qiniu_File *)0x0;
    local_e8.offset = 0;
    local_e8.status = 0;
    local_e8._20_4_ = 0;
    local_e8.abortUserData = extra_local->upAbortUserData;
    local_e8.abortCallback = extra_local->upAbortCallback;
    QVar4 = Qiniu_Rd_Reader_Open(&local_e8,localFile);
    if (QVar4.code == 200) {
      memset(&fi,0,0x90);
      QVar4 = Qiniu_File_Stat(local_e8.file,&fi);
      if (QVar4.code == 200) {
        curl_formadd(&form,&form.lastptr,1,"file",0x13,&local_e8,6,fi.st_size,0x10,pcVar3,0x11);
        goto LAB_00111f4d;
      }
    }
    pcVar3 = QVar4.message;
    uVar2 = QVar4.code;
  }
  Qiniu_Free(accessKey);
  Qiniu_Free(bucketName);
LAB_00111fc8:
  QVar4._4_4_ = 0;
  QVar4.code = uVar2;
  QVar4.message = pcVar3;
  return QVar4;
}

Assistant:

Qiniu_Error Qiniu_Io_PutFile(
    Qiniu_Client *self, Qiniu_Io_PutRet *ret,
    const char *uptoken, const char *key, const char *localFile, Qiniu_Io_PutExtra *extra)
{
    Qiniu_Error err = Qiniu_OK;
    Qiniu_FileInfo fi;
    Qiniu_Rd_Reader rdr;
    Qiniu_Io_form form;
    size_t fileSize;
    const char *localFileName = NULL, *accessKey = NULL, *bucketName = NULL;

    if (!Qiniu_Utils_Extract_Bucket(uptoken, &accessKey, &bucketName))
    {
        err.code = 400;
        err.message = "parse uptoken failed";
        return err;
    }

    Qiniu_Io_form_init(&form, uptoken, key, &extra);

    // BugFix : If the filename attribute of the file form-data section is not assigned or holds an empty string,
    //          and the real file size is larger than 10MB, then the Go server will return an error like
    //          "multipart: message too large".
    //          Assign an arbitary non-empty string to this attribute will force the Go server to write all the data
    //          into a temporary file and then every thing goes right.
    localFileName = (extra->localFileName) ? extra->localFileName : "QINIU-C-SDK-UP-FILE";

    //// For aborting uploading file.
    if (extra->upAbortCallback)
    {
        Qiniu_Zero(rdr);

        rdr.abortCallback = extra->upAbortCallback;
        rdr.abortUserData = extra->upAbortUserData;

        err = Qiniu_Rd_Reader_Open(&rdr, localFile);
        if (err.code != 200)
        {
            goto error;
        } // if

        Qiniu_Zero(fi);
        err = Qiniu_File_Stat(rdr.file, &fi);
        if (err.code != 200)
        {
            goto error;
        } // if

        fileSize = fi.st_size;

        curl_formadd(&form.formpost, &form.lastptr, CURLFORM_COPYNAME, "file", CURLFORM_STREAM, &rdr,
                     CURLFORM_CONTENTSLENGTH, (long)fileSize, CURLFORM_FILENAME, localFileName, CURLFORM_END);
    }
    else
    {
        curl_formadd(&form.formpost, &form.lastptr, CURLFORM_COPYNAME, "file", CURLFORM_FILE, localFile,
                     CURLFORM_FILENAME, localFileName, CURLFORM_END);
    } // if

    err = Qiniu_Io_call(self, accessKey, bucketName, ret, form.formpost, extra);

    //// For aborting uploading file.
    if (extra->upAbortCallback)
    {
        Qiniu_Rd_Reader_Close(&rdr);
        if (err.code == CURLE_ABORTED_BY_CALLBACK)
        {
            if (rdr.status == QINIU_RD_ABORT_BY_CALLBACK)
            {
                err.code = 9987;
                err.message = "Upload progress has been aborted by caller";
            }
            else if (rdr.status == QINIU_RD_ABORT_BY_READAT)
            {
                err.code = 9986;
                err.message = "Upload progress has been aborted by Qiniu_File_ReadAt()";
            } // if
        }     // if
    }         // if

error:
    Qiniu_Free((void *)accessKey);
    Qiniu_Free((void *)bucketName);
    return err;
}